

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldGenerator::GenerateMembers
          (RepeatedImmutableEnumFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  bool bVar1;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "private java.util.List<java.lang.Integer> $name$_;\nprivate static final com.google.protobuf.Internal.ListAdapter.Converter<\n    java.lang.Integer, $type$> $name$_converter_ =\n        new com.google.protobuf.Internal.ListAdapter.Converter<\n            java.lang.Integer, $type$>() {\n          public $type$ convert(java.lang.Integer from) {\n            @SuppressWarnings(\"deprecation\")\n            $type$ result = $type$.$for_number$(from);\n            return result == null ? $unknown$ : result;\n          }\n        };\n"
                    );
  PrintExtraFieldInfo(variables,printer);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_GETTER,false);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<$type$> ${$get$capitalized_name$List$}$() {\n  return new com.google.protobuf.Internal.ListAdapter<\n      java.lang.Integer, $type$>($name$_, $name$_converter_);\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_ADDER,false);
  io::Printer::Print(printer,variables,
                     "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n  return $name$_.size();\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  WriteFieldAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_GETTER,false);
  io::Printer::Print(printer,variables,
                     "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n  return $name$_converter_.convert($name$_.get(index));\n}\n"
                    );
  io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  if (*(int *)(*(long *)(this->descriptor_ + 0x28) + 0x3c) == 3) {
    WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,LIST_GETTER,false);
    io::Printer::Print(printer,variables,
                       "$deprecation$public java.util.List<java.lang.Integer>\n${$get$capitalized_name$ValueList$}$() {\n  return $name$_;\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer,this->descriptor_,LIST_INDEXED_GETTER,false);
    io::Printer::Print(printer,variables,
                       "$deprecation$public int ${$get$capitalized_name$Value$}$(int index) {\n  return $name$_.get(index);\n}\n"
                      );
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"{","}",this->descriptor_);
  }
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,variables,"private int $name$MemoizedSerializedSize;\n");
    return;
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private java.util.List<java.lang.Integer> $name$_;\n"
      "private static final "
      "com.google.protobuf.Internal.ListAdapter.Converter<\n"
      "    java.lang.Integer, $type$> $name$_converter_ =\n"
      "        new com.google.protobuf.Internal.ListAdapter.Converter<\n"
      "            java.lang.Integer, $type$>() {\n"
      "          public $type$ convert(java.lang.Integer from) {\n"
      "            @SuppressWarnings(\"deprecation\")\n"
      "            $type$ result = $type$.$for_number$(from);\n"
      "            return result == null ? $unknown$ : result;\n"
      "          }\n"
      "        };\n");
  PrintExtraFieldInfo(variables_, printer);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(
      variables_,
      "$deprecation$public java.util.List<$type$> "
      "${$get$capitalized_name$List$}$() {\n"
      "  return new com.google.protobuf.Internal.ListAdapter<\n"
      "      java.lang.Integer, $type$>($name$_, $name$_converter_);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER);
  printer->Print(
      variables_,
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return $name$_.size();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(
      variables_,
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return $name$_converter_.convert($name$_.get(index));\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_GETTER);
    printer->Print(variables_,
                   "$deprecation$public java.util.List<java.lang.Integer>\n"
                   "${$get$capitalized_name$ValueList$}$() {\n"
                   "  return $name$_;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_GETTER);
    printer->Print(variables_,
                   "$deprecation$public int "
                   "${$get$capitalized_name$Value$}$(int index) {\n"
                   "  return $name$_.get(index);\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  if (descriptor_->is_packed()) {
    printer->Print(variables_, "private int $name$MemoizedSerializedSize;\n");
  }
}